

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O3

bool __thiscall
crnlib::lzma_codec::unpack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  size_t destLen;
  size_t srcLen;
  ulong local_40;
  ulong local_38;
  
  if (buf->m_size != 0) {
    buf->m_size = 0;
  }
  if ((0x13 < n) && ((ushort)(*p << 8 | *p >> 8) == 0x304c)) {
    uVar5 = adler32((uchar *)((long)p + 3),0x11,1);
    if (*(char *)((long)p + 2) == (char)uVar5) {
      uVar9 = *(uint *)((long)p + 0xc);
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      if (uVar9 == 0) {
        return true;
      }
      if (0x40000000 < uVar9) {
        return false;
      }
      bVar4 = *(byte *)((long)p + 8);
      bVar7 = *(byte *)((long)p + 9);
      bVar1 = *(byte *)((long)p + 10);
      bVar2 = *(byte *)((long)p + 0xb);
      if ((bVar1 == 0 && (bVar7 == 0 && bVar4 == 0)) && bVar2 == 0) {
        return false;
      }
      uVar8 = buf->m_size;
      if (uVar8 != uVar9) {
        if (uVar8 <= uVar9) {
          if (buf->m_capacity < uVar9) {
            bVar3 = elemental_vector::increase_capacity
                              ((elemental_vector *)buf,uVar9,uVar8 + 1 == uVar9,1,(object_mover)0x0,
                               true);
            if (!bVar3) {
              return false;
            }
            uVar8 = buf->m_size;
          }
          memset(buf->m_p + uVar8,0,(ulong)(uVar9 - uVar8));
        }
        buf->m_size = uVar9;
        bVar4 = *(byte *)((long)p + 8);
        bVar7 = *(byte *)((long)p + 9);
        bVar1 = *(byte *)((long)p + 10);
        bVar2 = *(byte *)((long)p + 0xb);
      }
      local_38 = (ulong)n - 0x14;
      if (((ulong)bVar2 | (ulong)((uint)bVar1 << 8 | (uint)bVar7 << 0x10 | (uint)bVar4 << 0x18)) <=
          local_38) {
        uVar9 = *(uint *)((long)p + 0xc);
        local_40 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                          uVar9 << 0x18);
        iVar6 = (*this->m_pUncompress)
                          (buf->m_p,&local_40,(uchar *)((long)p + 0x14),&local_38,
                           (uchar *)((long)p + 3),5);
        if ((iVar6 == 0) &&
           (uVar9 = *(uint *)((long)p + 0xc),
           local_40 ==
           (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18))) {
          uVar5 = adler32(buf->m_p,(ulong)buf->m_size,1);
          uVar9 = *(uint *)((long)p + 0x10);
          if (uVar5 == (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                       uVar9 << 0x18)) {
            return true;
          }
        }
        if (buf->m_p != (uchar *)0x0) {
          crnlib_free(buf->m_p);
          buf->m_p = (uchar *)0x0;
          buf->m_size = 0;
          buf->m_capacity = 0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool lzma_codec::unpack(const void* p, uint n, crnlib::vector<uint8>& buf)
    {
        buf.resize(0);

        if (n < sizeof(header))
        {
            return false;
        }

        const header& hdr = *static_cast<const header*>(p);
        if (hdr.m_sig != header::cSig)
        {
            return false;
        }

        if (static_cast<uint8>(adler32((const uint8*)&hdr + header::cChecksumSkipBytes, sizeof(hdr) - header::cChecksumSkipBytes)) != hdr.m_checksum)
        {
            return false;
        }

        if (!hdr.m_uncomp_size)
        {
            return true;
        }

        if (!hdr.m_comp_size)
        {
            return false;
        }

        if (hdr.m_uncomp_size > 1024U * 1024U * 1024U)
        {
            return false;
        }

        if (!buf.try_resize(hdr.m_uncomp_size))
        {
            return false;
        }

        const uint8* pComp_data = static_cast<const uint8*>(p) + sizeof(header);
        size_t srcLen = n - sizeof(header);
        if (srcLen < hdr.m_comp_size)
        {
            return false;
        }

        size_t destLen = hdr.m_uncomp_size;

        int status = (*m_pUncompress)(&buf[0], &destLen, pComp_data, &srcLen, hdr.m_lzma_props, cLZMAPropsSize);

        if ((status != SZ_OK) || (destLen != hdr.m_uncomp_size))
        {
            buf.clear();
            return false;
        }

        if (adler32(&buf[0], buf.size()) != hdr.m_adler32)
        {
            buf.clear();
            return false;
        }

        return true;
    }